

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

bool __thiscall Divide<5,_1,_4>::propagate(Divide<5,_1,_4> *this)

{
  int iVar1;
  int iVar2;
  IntVar *pIVar3;
  IntVar *pIVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  
  pIVar3 = (this->x).var;
  pIVar4 = (this->y).var;
  lVar10 = (long)(this->x).b;
  lVar11 = lVar10 - (pIVar3->max).v;
  iVar7 = (pIVar3->min).v;
  iVar1 = (pIVar4->max).v;
  uVar8 = (ulong)(pIVar4->min).v;
  lVar16 = -uVar8;
  pIVar4 = (this->z).var;
  lVar14 = (long)(this->z).b;
  lVar13 = (pIVar4->min).v + lVar14;
  iVar2 = (pIVar4->max).v;
  lVar9 = (long)(~uVar8 + lVar11) / lVar16;
  if (lVar13 < lVar9) {
    if (so.lazy) {
      iVar5 = (*(pIVar3->super_Var).super_Branching._vptr_Branching[9])();
      uVar6 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar8 = (ulong)uVar6 << 0x20 | (long)iVar5 << 2 | 3;
    }
    else {
      uVar8 = 0;
    }
    pIVar3 = (this->z).var;
    iVar5 = (*(pIVar3->super_Var).super_Branching._vptr_Branching[0xe])
                      (pIVar3,lVar9 - (this->z).b,uVar8,1);
    if ((char)iVar5 == '\0') {
      return false;
    }
  }
  lVar10 = lVar10 - iVar7;
  lVar15 = -(long)iVar1;
  lVar9 = (lVar15 + lVar10 + -1) / lVar15;
  if (lVar9 < (long)(this->z).b + (long)(((this->z).var)->max).v) {
    if (so.lazy == true) {
      iVar7 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar6 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar8 = (ulong)uVar6 << 0x20 | (long)iVar7 << 2 | 3;
    }
    else {
      uVar8 = 0;
    }
    pIVar3 = (this->z).var;
    iVar7 = (*(pIVar3->super_Var).super_Branching._vptr_Branching[0xf])
                      (pIVar3,lVar9 - (this->z).b,uVar8,1);
    if ((char)iVar7 == '\0') {
      return false;
    }
  }
  uVar8 = lVar15 * (lVar13 + -1);
  if ((long)(this->x).b - (long)(((this->x).var)->max).v <= (long)uVar8) {
    if (so.lazy == true) {
      iVar7 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar6 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar12 = (ulong)uVar6 << 0x20 | (long)iVar7 << 2 | 3;
    }
    else {
      uVar12 = 0;
    }
    pIVar3 = (this->x).var;
    iVar7 = (*(pIVar3->super_Var).super_Branching._vptr_Branching[0xf])
                      (pIVar3,(long)(this->x).b + ~uVar8,uVar12,1);
    if ((char)iVar7 == '\0') {
      return false;
    }
  }
  lVar14 = iVar2 + lVar14;
  lVar16 = lVar16 * lVar14;
  if (lVar16 < (long)(this->x).b - (long)(((this->x).var)->min).v) {
    if (so.lazy == true) {
      iVar7 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar6 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar8 = (ulong)uVar6 << 0x20 | (long)iVar7 << 2 | 3;
    }
    else {
      uVar8 = 0;
    }
    pIVar3 = (this->x).var;
    iVar7 = (*(pIVar3->super_Var).super_Branching._vptr_Branching[0xe])
                      (pIVar3,(this->x).b - lVar16,uVar8,1);
    if ((char)iVar7 == '\0') {
      return false;
    }
  }
  if ((0 < lVar14) &&
     (lVar14 = (lVar11 + lVar14 + -1) / lVar14, lVar9 = (long)(((this->y).var)->max).v,
     lVar11 = -lVar9, lVar14 != lVar11 && SBORROW8(lVar14,lVar11) == lVar14 + lVar9 < 0)) {
    if (so.lazy == true) {
      iVar7 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar6 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar8 = (ulong)uVar6 << 0x20 | (long)iVar7 << 2 | 3;
    }
    else {
      uVar8 = 0;
    }
    pIVar3 = (this->y).var;
    iVar7 = (*(pIVar3->super_Var).super_Branching._vptr_Branching[0xf])(pIVar3,-lVar14,uVar8,1);
    if ((char)iVar7 == '\0') {
      return false;
    }
  }
  if (lVar13 < 2) {
    return true;
  }
  lVar9 = (lVar13 + lVar10 + -2) / (lVar13 + -1);
  lVar14 = (long)(((this->y).var)->min).v;
  lVar10 = -lVar14;
  if (lVar9 == lVar10 || SBORROW8(lVar9,lVar10) != lVar9 + lVar14 < 0) {
    if (so.lazy == true) {
      iVar7 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar6 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar8 = (ulong)uVar6 << 0x20 | (long)iVar7 << 2 | 3;
    }
    else {
      uVar8 = 0;
    }
    pIVar3 = (this->y).var;
    iVar7 = (*(pIVar3->super_Var).super_Branching._vptr_Branching[0xe])(pIVar3,1 - lVar9,uVar8,1);
    if ((char)iVar7 == '\0') {
      return false;
    }
    return true;
  }
  return true;
}

Assistant:

bool propagate() override {
		const int64_t x_min = x.getMin();
		const int64_t x_max = x.getMax();
		const int64_t y_min = y.getMin();
		const int64_t y_max = y.getMax();
		const int64_t z_min = z.getMin();
		const int64_t z_max = z.getMax();

		// z >= ceil(x.min / y.max)
		setDom(z, setMin, (x_min + y_max - 1) / y_max, x.getMinLit(), y.getMaxLit());
		// z <= ceil(x.max / y.min)
		setDom(z, setMax, (x_max + y_min - 1) / y_min, x.getMaxLit(), y.getMinLit());

		// x >= y.min * (z.min - 1) + 1
		setDom(x, setMin, y_min * (z_min - 1) + 1, y.getMinLit(), z.getMinLit());
		// x <= y.max * z.max
		setDom(x, setMax, y_max * z_max, y.getMaxLit(), z.getMaxLit());

		// y >= ceil(x.min / z.max)
		if (z_max >= 1) {
			setDom(y, setMin, (x_min + z_max - 1) / z_max, x.getMinLit(), z.getMaxLit());
		}

		// y <= ceil(x.max / z.min-1) - 1
		if (z_min >= 2) {
			setDom(y, setMax, (x_max + z_min - 2) / (z_min - 1) - 1, x.getMaxLit(), z.getMinLit());
		}

		return true;
	}